

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O1

bikes_allowed_t parse_bike_allowance(char *value)

{
  int iVar1;
  bikes_allowed_t bVar2;
  
  iVar1 = strcmp(value,"0");
  bVar2 = BA_UNKNOWN;
  if ((iVar1 != 0) && (*value != '\0')) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      bVar2 = BA_POSSIBLE;
    }
    else {
      iVar1 = strcmp(value,"2");
      bVar2 = BA_NOT_SET - (iVar1 == 0);
    }
  }
  return bVar2;
}

Assistant:

bikes_allowed_t parse_bike_allowance(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return BA_UNKNOWN;
    else if (strcmp(value, "1") == 0)
        return BA_POSSIBLE;
    else if (strcmp(value, "2") == 0)
        return BA_NOT_POSSIBLE;
    else
        return BA_NOT_SET;
}